

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O3

void __thiscall MeCab::Viterbi::~Viterbi(Viterbi *this)

{
  pointer pcVar1;
  Connector *pCVar2;
  Tokenizer<mecab_node_t,_mecab_path_t> *pTVar3;
  
  this->_vptr_Viterbi = (_func_int **)&PTR__Viterbi_00172dc0;
  pcVar1 = (this->what_).str_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->what_).str_.field_2) {
    operator_delete(pcVar1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->what_);
  std::ios_base::~ios_base((ios_base *)&(this->what_).field_0x70);
  (this->connector_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00172eb0;
  pCVar2 = (this->connector_).ptr_;
  if (pCVar2 != (Connector *)0x0) {
    (*pCVar2->_vptr_Connector[1])();
  }
  (this->tokenizer_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00172e80;
  pTVar3 = (this->tokenizer_).ptr_;
  if (pTVar3 != (Tokenizer<mecab_node_t,_mecab_path_t> *)0x0) {
    (*pTVar3->_vptr_Tokenizer[1])();
    return;
  }
  return;
}

Assistant:

Viterbi::~Viterbi() {}